

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsTestDriver.cpp
# Opt level: O1

bool __thiscall
xs::TestDriver::writeMessage(TestDriver *this,ByteBuffer *messageBuffer,Message *message)

{
  int iVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  
  (*message->_vptr_Message[2])(message);
  iVar1 = messageBuffer->m_size - messageBuffer->m_numElements;
  if (-1 < iVar1) {
    de::RingBuffer<unsigned_char>::pushFront(messageBuffer,(uchar *)0x0,0);
  }
  return -1 < iVar1;
}

Assistant:

bool TestDriver::writeMessage (ByteBuffer& messageBuffer, const Message& message)
{
	vector<deUint8> buf;
	message.write(buf);

	if (messageBuffer.getNumFree() < (int)buf.size())
		return false;

	messageBuffer.pushFront(&buf[0], (int)buf.size());
	return true;
}